

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_3;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  
  ci.nreqs = 4;
  ci.stride = 0xa0;
  ci.reqs = reqs;
  loop = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(loop,reqs,getaddrinfo_cb,"fail",(char *)0x0,(addrinfo *)0x0);
  hints._0_8_ = SEXT48(iVar1);
  if (hints._0_8_ == 0) {
    iVar1 = uv_getaddrinfo(loop,reqs + 1,getaddrinfo_cb,(char *)0x0,"fail",(addrinfo *)0x0);
    hints._0_8_ = SEXT48(iVar1);
    if (hints._0_8_ == 0) {
      iVar1 = uv_getaddrinfo(loop,reqs + 2,getaddrinfo_cb,"fail","fail",(addrinfo *)0x0);
      hints._0_8_ = SEXT48(iVar1);
      if (hints._0_8_ == 0) {
        iVar1 = uv_getaddrinfo(loop,reqs + 3,getaddrinfo_cb,"fail",(char *)0x0,&hints);
        eval_b = (int64_t)iVar1;
        eval_b_3 = 0;
        if (eval_b == 0) {
          iVar1 = uv_timer_init(loop,&ci.timer_handle);
          eval_b = (int64_t)iVar1;
          eval_b_3 = 0;
          if (eval_b == 0) {
            iVar1 = uv_timer_start(&ci.timer_handle,timer_cb,10,0);
            eval_b = (int64_t)iVar1;
            eval_b_3 = 0;
            if (eval_b == 0) {
              iVar1 = uv_run(loop,UV_RUN_DEFAULT);
              eval_b = (int64_t)iVar1;
              eval_b_3 = 0;
              if (eval_b == 0) {
                eval_b = 1;
                eval_b_3 = (int64_t)timer_cb_called;
                if (eval_b_3 == 1) {
                  close_loop(loop);
                  eval_b = 0;
                  iVar1 = uv_loop_close(loop);
                  eval_b_3 = (int64_t)iVar1;
                  if (eval_b_3 == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar4 = "uv_loop_close(loop)";
                  pcVar3 = "0";
                  uVar2 = 0xe4;
                }
                else {
                  pcVar4 = "timer_cb_called";
                  pcVar3 = "1";
                  uVar2 = 0xe2;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                uVar2 = 0xe1;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)";
              uVar2 = 0xe0;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_timer_init(loop, &ci.timer_handle)";
            uVar2 = 0xdf;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0xdd;
        }
        goto LAB_001935a5;
      }
      uVar2 = 0xda;
    }
    else {
      uVar2 = 0xd7;
    }
  }
  else {
    uVar2 = 0xd4;
  }
  pcVar4 = "0";
  pcVar3 = "r";
  eval_b_3 = 0;
  eval_b = hints._0_8_;
LAB_001935a5:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT_OK(r);

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}